

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS ref_node_bary3(REF_NODE ref_node,REF_INT *nodes,REF_DBL *xyz,REF_DBL *bary)

{
  int iVar1;
  int iVar2;
  int iVar3;
  REF_DBL *pRVar4;
  REF_DBL *pRVar5;
  REF_DBL *pRVar6;
  double local_c8;
  double local_b8;
  double local_b0;
  double local_a0;
  double local_98;
  double local_88;
  int local_7c;
  REF_INT i;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL normal [3];
  REF_DBL total;
  REF_DBL *xyz2;
  REF_DBL *xyz1;
  REF_DBL *xyz0;
  REF_DBL *bary_local;
  REF_DBL *xyz_local;
  REF_INT *nodes_local;
  REF_NODE ref_node_local;
  
  if ((((((*nodes < 0) || (ref_node->max <= *nodes)) || (ref_node->global[*nodes] < 0)) ||
       ((nodes[1] < 0 || (ref_node->max <= nodes[1])))) ||
      ((ref_node->global[nodes[1]] < 0 || ((nodes[2] < 0 || (ref_node->max <= nodes[2])))))) ||
     (ref_node->global[nodes[2]] < 0)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xacf,
           "ref_node_bary3",3,"node invalid");
    ref_node_local._4_4_ = 3;
  }
  else {
    pRVar4 = ref_node->real;
    iVar1 = *nodes;
    pRVar5 = ref_node->real;
    iVar2 = nodes[1];
    pRVar6 = ref_node->real;
    iVar3 = nodes[2];
    ref_node_local._4_4_ =
         ref_node_xyz_normal(xyz,pRVar5 + iVar2 * 0xf,pRVar6 + iVar3 * 0xf,
                             (REF_DBL *)&ref_private_macro_code_rss_1);
    if (ref_node_local._4_4_ == 0) {
      *bary = normal[1];
      ref_node_local._4_4_ =
           ref_node_xyz_normal(pRVar4 + iVar1 * 0xf,xyz,pRVar6 + iVar3 * 0xf,
                               (REF_DBL *)&ref_private_macro_code_rss_1);
      if (ref_node_local._4_4_ == 0) {
        bary[1] = normal[1];
        ref_node_local._4_4_ =
             ref_node_xyz_normal(pRVar4 + iVar1 * 0xf,pRVar5 + iVar2 * 0xf,xyz,
                                 (REF_DBL *)&ref_private_macro_code_rss_1);
        if (ref_node_local._4_4_ == 0) {
          bary[2] = normal[1];
          normal[2] = *bary + bary[1] + bary[2];
          if (normal[2] * 1e+20 <= 0.0) {
            local_88 = -(normal[2] * 1e+20);
          }
          else {
            local_88 = normal[2] * 1e+20;
          }
          if (*bary <= 0.0) {
            local_98 = -*bary;
          }
          else {
            local_98 = *bary;
          }
          if (local_98 < local_88) {
            if (normal[2] * 1e+20 <= 0.0) {
              local_a0 = -(normal[2] * 1e+20);
            }
            else {
              local_a0 = normal[2] * 1e+20;
            }
            if (bary[1] <= 0.0) {
              local_b0 = -bary[1];
            }
            else {
              local_b0 = bary[1];
            }
            if (local_b0 < local_a0) {
              if (normal[2] * 1e+20 <= 0.0) {
                local_b8 = -(normal[2] * 1e+20);
              }
              else {
                local_b8 = normal[2] * 1e+20;
              }
              if (bary[2] <= 0.0) {
                local_c8 = -bary[2];
              }
              else {
                local_c8 = bary[2];
              }
              if (local_c8 < local_b8) {
                *bary = *bary / normal[2];
                bary[1] = bary[1] / normal[2];
                bary[2] = bary[2] / normal[2];
                return 0;
              }
            }
          }
          printf("%s: %d: %s: div zero total %.18e norms %.18e %.18e %.18e\n",normal[2],*bary,
                 bary[1],bary[2],
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0xae7,"ref_node_bary3");
          for (local_7c = 0; local_7c < 3; local_7c = local_7c + 1) {
            bary[local_7c] = 0.0;
          }
          ref_node_local._4_4_ = 4;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0xad9,"ref_node_bary3",(ulong)ref_node_local._4_4_,"n2");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0xad7,"ref_node_bary3",(ulong)ref_node_local._4_4_,"n1");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xad5,
             "ref_node_bary3",(ulong)ref_node_local._4_4_,"n0");
    }
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_node_bary3(REF_NODE ref_node, REF_INT *nodes,
                                  REF_DBL *xyz, REF_DBL *bary) {
  REF_DBL *xyz0, *xyz1, *xyz2;
  REF_DBL total, normal[3];

  if (!ref_node_valid(ref_node, nodes[0]) ||
      !ref_node_valid(ref_node, nodes[1]) ||
      !ref_node_valid(ref_node, nodes[2]))
    RSS(REF_INVALID, "node invalid");

  xyz0 = ref_node_xyz_ptr(ref_node, nodes[0]);
  xyz1 = ref_node_xyz_ptr(ref_node, nodes[1]);
  xyz2 = ref_node_xyz_ptr(ref_node, nodes[2]);

  RSS(ref_node_xyz_normal(xyz, xyz1, xyz2, normal), "n0");
  bary[0] = normal[2];
  RSS(ref_node_xyz_normal(xyz0, xyz, xyz2, normal), "n1");
  bary[1] = normal[2];
  RSS(ref_node_xyz_normal(xyz0, xyz1, xyz, normal), "n2");
  bary[2] = normal[2];

  total = bary[0] + bary[1] + bary[2];

  if (ref_math_divisible(bary[0], total) &&
      ref_math_divisible(bary[1], total) &&
      ref_math_divisible(bary[2], total)) {
    bary[0] /= total;
    bary[1] /= total;
    bary[2] /= total;
  } else {
    REF_INT i;
    printf("%s: %d: %s: div zero total %.18e norms %.18e %.18e %.18e\n",
           __FILE__, __LINE__, __func__, total, bary[0], bary[1], bary[2]);
    for (i = 0; i < 3; i++) bary[i] = 0.0;
    return REF_DIV_ZERO;
  }

  return REF_SUCCESS;
}